

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.c
# Opt level: O0

int yaml_emitter_flush(yaml_emitter_t *emitter)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  ulong local_38;
  size_t k;
  uint value;
  uint width;
  uchar octet;
  int high;
  int low;
  yaml_emitter_t *emitter_local;
  
  if (emitter == (yaml_emitter_t *)0x0) {
    __assert_fail("emitter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/yaml/src/writer.c"
                  ,0x24,"int yaml_emitter_flush(yaml_emitter_t *)");
  }
  if (emitter->write_handler != (yaml_write_handler_t *)0x0) {
    if (emitter->encoding != YAML_ANY_ENCODING) {
      (emitter->buffer).last = (emitter->buffer).pointer;
      (emitter->buffer).pointer = (emitter->buffer).start;
      if ((emitter->buffer).start == (emitter->buffer).last) {
        emitter_local._4_4_ = 1;
      }
      else if (emitter->encoding == YAML_UTF8_ENCODING) {
        iVar2 = (*emitter->write_handler)
                          (emitter->write_handler_data,(emitter->buffer).start,
                           (long)(emitter->buffer).last - (long)(emitter->buffer).start);
        if (iVar2 == 0) {
          emitter_local._4_4_ = yaml_emitter_set_writer_error(emitter,"write error");
        }
        else {
          (emitter->buffer).last = (emitter->buffer).start;
          (emitter->buffer).pointer = (emitter->buffer).start;
          emitter_local._4_4_ = 1;
        }
      }
      else {
        uVar3 = (uint)(emitter->encoding != YAML_UTF16LE_ENCODING);
        uVar4 = (uint)(emitter->encoding == YAML_UTF16LE_ENCODING);
        while ((emitter->buffer).pointer != (emitter->buffer).last) {
          bVar1 = *(emitter->buffer).pointer;
          if ((bVar1 & 0x80) == 0) {
            local_3c = 1;
          }
          else {
            if ((bVar1 & 0xe0) == 0xc0) {
              local_40 = 2;
            }
            else {
              if ((bVar1 & 0xf0) == 0xe0) {
                local_44 = 3;
              }
              else {
                local_44 = 0;
                if ((bVar1 & 0xf8) == 0xf0) {
                  local_44 = 4;
                }
              }
              local_40 = local_44;
            }
            local_3c = local_40;
          }
          if ((bVar1 & 0x80) == 0) {
            local_48 = bVar1 & 0x7f;
          }
          else {
            if ((bVar1 & 0xe0) == 0xc0) {
              local_4c = bVar1 & 0x1f;
            }
            else {
              if ((bVar1 & 0xf0) == 0xe0) {
                local_50 = bVar1 & 0xf;
              }
              else {
                if ((bVar1 & 0xf8) == 0xf0) {
                  local_54 = bVar1 & 7;
                }
                else {
                  local_54 = 0;
                }
                local_50 = local_54;
              }
              local_4c = local_50;
            }
            local_48 = local_4c;
          }
          k._4_4_ = local_48;
          for (local_38 = 1; local_38 < local_3c; local_38 = local_38 + 1) {
            k._4_4_ = k._4_4_ * 0x40 + ((emitter->buffer).pointer[local_38] & 0x3f);
          }
          (emitter->buffer).pointer = (emitter->buffer).pointer + local_3c;
          if (k._4_4_ < 0x10000) {
            (emitter->raw_buffer).last[(int)uVar4] = (uchar)(k._4_4_ >> 8);
            (emitter->raw_buffer).last[(int)uVar3] = (uchar)k._4_4_;
            (emitter->raw_buffer).last = (emitter->raw_buffer).last + 2;
          }
          else {
            uVar5 = k._4_4_ - 0x10000;
            (emitter->raw_buffer).last[(int)uVar4] = (char)(uVar5 >> 0x12) + 0xd8;
            (emitter->raw_buffer).last[(int)uVar3] = (uchar)(uVar5 >> 10);
            (emitter->raw_buffer).last[(int)(uVar4 + 2)] = (char)(uVar5 >> 8) + 0xdc;
            (emitter->raw_buffer).last[(int)(uVar3 + 2)] = (uchar)uVar5;
            (emitter->raw_buffer).last = (emitter->raw_buffer).last + 4;
          }
        }
        iVar2 = (*emitter->write_handler)
                          (emitter->write_handler_data,(emitter->raw_buffer).start,
                           (long)(emitter->raw_buffer).last - (long)(emitter->raw_buffer).start);
        if (iVar2 == 0) {
          emitter_local._4_4_ = yaml_emitter_set_writer_error(emitter,"write error");
        }
        else {
          (emitter->buffer).last = (emitter->buffer).start;
          (emitter->buffer).pointer = (emitter->buffer).start;
          (emitter->raw_buffer).last = (emitter->raw_buffer).start;
          (emitter->raw_buffer).pointer = (emitter->raw_buffer).start;
          emitter_local._4_4_ = 1;
        }
      }
      return emitter_local._4_4_;
    }
    __assert_fail("emitter->encoding",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/yaml/src/writer.c"
                  ,0x26,"int yaml_emitter_flush(yaml_emitter_t *)");
  }
  __assert_fail("emitter->write_handler",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/yaml/src/writer.c"
                ,0x25,"int yaml_emitter_flush(yaml_emitter_t *)");
}

Assistant:

YAML_DECLARE(int)
yaml_emitter_flush(yaml_emitter_t *emitter)
{
    int low, high;

    assert(emitter);    /* Non-NULL emitter object is expected. */
    assert(emitter->write_handler); /* Write handler must be set. */
    assert(emitter->encoding);  /* Output encoding must be set. */

    emitter->buffer.last = emitter->buffer.pointer;
    emitter->buffer.pointer = emitter->buffer.start;

    /* Check if the buffer is empty. */

    if (emitter->buffer.start == emitter->buffer.last) {
        return 1;
    }

    /* If the output encoding is UTF-8, we don't need to recode the buffer. */

    if (emitter->encoding == YAML_UTF8_ENCODING)
    {
        if (emitter->write_handler(emitter->write_handler_data,
                    emitter->buffer.start,
                    emitter->buffer.last - emitter->buffer.start)) {
            emitter->buffer.last = emitter->buffer.start;
            emitter->buffer.pointer = emitter->buffer.start;
            return 1;
        }
        else {
            return yaml_emitter_set_writer_error(emitter, "write error");
        }
    }

    /* Recode the buffer into the raw buffer. */

    low = (emitter->encoding == YAML_UTF16LE_ENCODING ? 0 : 1);
    high = (emitter->encoding == YAML_UTF16LE_ENCODING ? 1 : 0);

    while (emitter->buffer.pointer != emitter->buffer.last)
    {
        unsigned char octet;
        unsigned int width;
        unsigned int value;
        size_t k;

        /* 
         * See the "reader.c" code for more details on UTF-8 encoding.  Note
         * that we assume that the buffer contains a valid UTF-8 sequence.
         */

        /* Read the next UTF-8 character. */

        octet = emitter->buffer.pointer[0];

        width = (octet & 0x80) == 0x00 ? 1 :
                (octet & 0xE0) == 0xC0 ? 2 :
                (octet & 0xF0) == 0xE0 ? 3 :
                (octet & 0xF8) == 0xF0 ? 4 : 0;

        value = (octet & 0x80) == 0x00 ? octet & 0x7F :
                (octet & 0xE0) == 0xC0 ? octet & 0x1F :
                (octet & 0xF0) == 0xE0 ? octet & 0x0F :
                (octet & 0xF8) == 0xF0 ? octet & 0x07 : 0;

        for (k = 1; k < width; k ++) {
            octet = emitter->buffer.pointer[k];
            value = (value << 6) + (octet & 0x3F);
        }

        emitter->buffer.pointer += width;

        /* Write the character. */

        if (value < 0x10000)
        {
            emitter->raw_buffer.last[high] = value >> 8;
            emitter->raw_buffer.last[low] = value & 0xFF;

            emitter->raw_buffer.last += 2;
        }
        else
        {
            /* Write the character using a surrogate pair (check "reader.c"). */

            value -= 0x10000;
            emitter->raw_buffer.last[high] = 0xD8 + (value >> 18);
            emitter->raw_buffer.last[low] = (value >> 10) & 0xFF;
            emitter->raw_buffer.last[high+2] = 0xDC + ((value >> 8) & 0xFF);
            emitter->raw_buffer.last[low+2] = value & 0xFF;

            emitter->raw_buffer.last += 4;
        }
    }

    /* Write the raw buffer. */

    if (emitter->write_handler(emitter->write_handler_data,
                emitter->raw_buffer.start,
                emitter->raw_buffer.last - emitter->raw_buffer.start)) {
        emitter->buffer.last = emitter->buffer.start;
        emitter->buffer.pointer = emitter->buffer.start;
        emitter->raw_buffer.last = emitter->raw_buffer.start;
        emitter->raw_buffer.pointer = emitter->raw_buffer.start;
        return 1;
    }
    else {
        return yaml_emitter_set_writer_error(emitter, "write error");
    }
}